

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O2

raw_ostream * __thiscall
llvm::raw_ostream::write_escaped(raw_ostream *this,StringRef Str,bool UseHexEscapes)

{
  raw_ostream *prVar1;
  raw_ostream *this_00;
  uchar UC;
  byte bVar2;
  byte C;
  char C_00;
  size_t sVar3;
  
  sVar3 = 0;
  do {
    if (Str.Length == sVar3) {
      return this;
    }
    bVar2 = Str.Data[sVar3];
    if (bVar2 == 9) {
      prVar1 = operator<<(this,'\\');
      C = 0x74;
LAB_0015b3bf:
      operator<<(prVar1,C);
    }
    else {
      if (bVar2 == 10) {
        prVar1 = operator<<(this,'\\');
        C = 0x6e;
        goto LAB_0015b3bf;
      }
      if (bVar2 == 0x22) {
        prVar1 = operator<<(this,'\\');
        C = 0x22;
        goto LAB_0015b3bf;
      }
      if (bVar2 == 0x5c) {
        prVar1 = operator<<(this,'\\');
        C = 0x5c;
        goto LAB_0015b3bf;
      }
      if (0x5e < (byte)(bVar2 - 0x20)) {
        this_00 = operator<<(this,'\\');
        prVar1 = this;
        if (UseHexEscapes) {
          operator<<(this_00,'x');
          C_00 = (bVar2 >> 4) + 0x37;
          if (bVar2 < 0xa0) {
            C_00 = (bVar2 >> 4) + 0x30;
          }
          operator<<(this,C_00);
          bVar2 = bVar2 & 0xf;
          C = bVar2 + 0x37;
          if (bVar2 < 10) {
            C = bVar2 + 0x30;
          }
        }
        else {
          operator<<(this,bVar2 >> 6 | 0x30);
          operator<<(this,bVar2 >> 3 & 7 | 0x30);
          C = bVar2 & 7 | 0x30;
        }
        goto LAB_0015b3bf;
      }
      operator<<(this,bVar2);
    }
    sVar3 = sVar3 + 1;
  } while( true );
}

Assistant:

raw_ostream &raw_ostream::write_escaped(StringRef Str,
                                        bool UseHexEscapes) {
  for (unsigned char c : Str) {
    switch (c) {
    case '\\':
      *this << '\\' << '\\';
      break;
    case '\t':
      *this << '\\' << 't';
      break;
    case '\n':
      *this << '\\' << 'n';
      break;
    case '"':
      *this << '\\' << '"';
      break;
    default:
      if (isPrint(c)) {
        *this << c;
        break;
      }

      // Write out the escaped representation.
      if (UseHexEscapes) {
        *this << '\\' << 'x';
        *this << hexdigit((c >> 4 & 0xF));
        *this << hexdigit((c >> 0) & 0xF);
      } else {
        // Always use a full 3-character octal escape.
        *this << '\\';
        *this << char('0' + ((c >> 6) & 7));
        *this << char('0' + ((c >> 3) & 7));
        *this << char('0' + ((c >> 0) & 7));
      }
    }
  }

  return *this;
}